

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

string * __thiscall pbrt::ShapeSample::ToString_abi_cxx11_(ShapeSample *this)

{
  string *in_RDI;
  Interaction *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::Interaction_const&,float_const&>
            (in_stack_00000018,in_stack_00000010,(float *)this);
  return in_RDI;
}

Assistant:

std::string ShapeSample::ToString() const {
    return StringPrintf("[ ShapeSample intr: %s pdf: %f ]", intr, pdf);
}